

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddExtension(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *filename,
            FieldDescriptorProto *field,pair<const_void_*,_int> value)

{
  string *psVar1;
  undefined8 value_00;
  bool bVar2;
  LogMessage *pLVar3;
  bool bVar4;
  undefined1 local_a0 [32];
  int32 local_80;
  undefined1 local_68 [8];
  pair<const_void_*,_int> value_local;
  int **local_50;
  char *local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  
  local_68 = (undefined1  [8])value.first;
  value_local.first._0_4_ = value.second;
  psVar1 = (field->extendee_).ptr_;
  bVar4 = true;
  if ((psVar1->_M_string_length != 0) && (*(psVar1->_M_dataplus)._M_p == '.')) {
    value_local._8_8_ = filename;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
    local_80 = field->number_;
    if (local_50 == (int **)local_40) {
      local_a0._24_8_ = uStack_38;
      local_a0._0_8_ = local_a0 + 0x10;
    }
    else {
      local_a0._0_8_ = local_50;
    }
    local_a0._8_8_ = local_48;
    local_48 = (char *)0x0;
    local_40[0] = 0;
    local_50 = (int **)local_40;
    bVar2 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>>
                      (&this->by_extension_,(first_type *)local_a0,(second_type *)local_68);
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_);
    }
    value_00 = value_local._8_8_;
    if (local_50 != (int **)local_40) {
      operator_delete(local_50);
    }
    if (!bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_a0,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor_database.cc"
                 ,0xe8);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)local_a0,
                          "Extension conflicts with extension already in database: extend ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(field->extendee_).ptr_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," { ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(field->name_).ptr_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," = ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,field->number_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," } from:");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)value_00);
      internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const std::string& filename, const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}